

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O3

char * rtmidi_get_port_name(RtMidiPtr device,uint portNumber)

{
  char *pcVar1;
  string name;
  long *local_38 [2];
  long local_28 [2];
  
  (**(code **)(*device->ptr + 0x18))(local_38,device->ptr,portNumber);
  pcVar1 = strdup((char *)local_38[0]);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return pcVar1;
}

Assistant:

const char* rtmidi_get_port_name (RtMidiPtr device, unsigned int portNumber)
{
    try {
        std::string name = ((RtMidi*) device->ptr)->getPortName (portNumber);
        return strdup (name.c_str ());

    } catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        return "";
    }
}